

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io.c
# Opt level: O3

int gdGetWordLSB(short *result,gdIOCtx *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = (*ctx->getC)(ctx);
  iVar3 = 0;
  if (iVar1 != -1) {
    iVar2 = (*ctx->getC)(ctx);
    iVar3 = 0;
    if ((iVar2 != -1) && (iVar3 = 1, result != (short *)0x0)) {
      *result = (ushort)(iVar2 << 8) | (ushort)iVar1;
    }
  }
  return iVar3;
}

Assistant:

int gdGetWordLSB(signed short int *result, gdIOCtx *ctx)
{
	int high = 0, low = 0;
	low = (ctx->getC) (ctx);
	if (low == EOF) {
		return 0;
	}

	high = (ctx->getC) (ctx);
	if (high == EOF) {
		return 0;
	}

	if (result) {
		*result = (high << 8) | low;
	}

	return 1;
}